

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iostream-test.c++
# Opt level: O2

void __thiscall kj::std::anon_unknown_0::TestCase49::run(TestCase49 *this)

{
  byte *pbVar1;
  StdInputStream in;
  StdOutputStream out;
  ArrayPtr<unsigned_char> local_218;
  ArrayPtr<const_unsigned_char> local_208;
  byte buf [9];
  DebugComparison<kj::ArrayPtr<const_unsigned_char>,_kj::ArrayPtr<unsigned_char>_> _kjCondition;
  stringstream ss;
  ostream local_1a0 [376];
  
  ::std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  in.super_InputStream._vptr_InputStream = (_func_int **)&PTR__BufferedInputStream_0021df48;
  out.stream_ = local_1a0;
  out.super_OutputStream._vptr_OutputStream = (_func_int **)&PTR__ArrayOutputStream_0021df90;
  in.stream_ = (istream *)&ss;
  ::std::ostream::write((char *)out.stream_,0x1c5ba0);
  buf[8] = '\0';
  buf[0] = '\0';
  buf[1] = '\0';
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  buf[6] = '\0';
  buf[7] = '\0';
  ::std::istream::read((char *)&ss,(long)buf);
  pbVar1 = *(byte **)(in.stream_ + 8);
  local_208.ptr =
       "foobar/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
  ;
  local_208.size_ = 6;
  local_218.ptr = buf;
  local_218.size_ = (size_t)pbVar1;
  _::DebugExpression<kj::ArrayPtr<unsigned_char_const>>::operator==
            (&_kjCondition,(DebugExpression<kj::ArrayPtr<unsigned_char_const>> *)&local_208,
             &local_218);
  if ((_kjCondition.result == false) && (_::Debug::minSeverity < 3)) {
    local_208.ptr =
         "foobar/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/mutex-test.c++"
    ;
    local_208.size_ = 6;
    local_218.ptr = buf;
    local_218.size_ = (size_t)pbVar1;
    _::Debug::
    log<char_const(&)[65],kj::_::DebugComparison<kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>&,kj::ArrayPtr<unsigned_char_const>,kj::ArrayPtr<unsigned_char>>
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/std/iostream-test.c++"
               ,0x3d,ERROR,
               "\"failed: expected \" \"(\\\"foobar\\\"_kjb) == (arrayPtr(buf).first(amount))\", _kjCondition, \"foobar\"_kjb, arrayPtr(buf).first(amount)"
               ,(char (*) [65])"failed: expected (\"foobar\"_kjb) == (arrayPtr(buf).first(amount))",
               &_kjCondition,&local_208,&local_218);
  }
  ArrayOutputStream::~ArrayOutputStream((ArrayOutputStream *)&out);
  BufferedInputStream::~BufferedInputStream((BufferedInputStream *)&in);
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return;
}

Assistant:

TEST(StdIoStream, TryReadToEndOfFile) {
  // Check that tryRead works when eof is reached before minBytes.

  ::std::stringstream ss;

  StdInputStream in(ss);
  StdOutputStream out(ss);

  out.write("foobar"_kjb);

  byte buf[9]{};
  auto amount = in.tryRead(buf, 8);
  EXPECT_EQ("foobar"_kjb, arrayPtr(buf).first(amount));
}